

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
          *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this_00;
  GTestLog local_20;
  GTestLog local_1c;
  
  iVar2 = (*(this->
            super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x36f);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::endl<char,std::char_traits<char>>(poVar4);
    GTestLog::~GTestLog(&local_20);
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)other->_vptr_ParamIteratorInterface[-1],
                     (type_info *)
                     &CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                      ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::typeinfo);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45e);
    std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *)
            __dynamic_cast(other,&ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>>
                                  ::typeinfo,
                           &CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                            ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::
                            typeinfo,0);
  bVar1 = AtEnd(this);
  if ((bVar1) && (bVar1 = AtEnd(this_00), bVar1)) {
    return true;
  }
  bVar1 = ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                      ._M_head_impl,
                     &(this_00->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                      ._M_head_impl);
  if (((bVar1) &&
      (bVar1 = ParamIterator<libaom_test::TestMode>::operator==
                         (&(this->current_).
                           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                           .
                           super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                           .
                           super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                           ._M_head_impl,
                          &(this_00->current_).
                           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                           .
                           super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                           .
                           super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                           ._M_head_impl), bVar1)) &&
     (bVar1 = ParamIterator<(anonymous_namespace)::TestVideoParam>::operator==
                        (&(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
                          ._M_head_impl,
                         &(this_00->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
                          ._M_head_impl), bVar1)) {
    bVar1 = ParamIterator<int>::operator==
                      ((ParamIterator<int> *)&this->current_,
                       (ParamIterator<int> *)&this_00->current_);
    return bVar1;
  }
  return false;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }